

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize_unittest.cc
# Opt level: O0

char * SymbolizeStackConsumption(void *pc,int *stack_consumed)

{
  int iVar1;
  __pid_t _Var2;
  ostream *poVar3;
  SendMethod in_R9;
  LogMessage local_26a8;
  LogMessageVoidify local_2642;
  byte local_2641;
  code *local_2640;
  undefined8 uStack_2638;
  LogMessage local_2630;
  LogMessageVoidify local_25ca;
  byte local_25c9;
  code *local_25c8;
  undefined8 uStack_25c0;
  LogMessage local_25b8;
  LogMessageVoidify local_2551;
  LogMessage local_2550;
  LogMessage local_24f0;
  LogMessage local_2490;
  int local_2430;
  byte local_2429;
  int stack_consumption2;
  undefined8 uStack_2420;
  LogMessage local_2418;
  LogMessageVoidify local_23b1;
  int local_23b0;
  byte local_23a9;
  int stack_consumption1;
  undefined8 uStack_23a0;
  LogMessage local_2398;
  LogMessageVoidify local_2332;
  byte local_2331;
  code *local_2330;
  undefined8 uStack_2328;
  LogMessage local_2320;
  LogMessageVoidify local_22ba;
  byte local_22b9;
  code *local_22b8;
  undefined8 uStack_22b0;
  LogMessage local_22a8;
  LogMessageVoidify local_2241;
  undefined1 local_2240 [8];
  sigaction old_sa2;
  sigaction old_sa1;
  sigaction sa;
  LogMessage local_2050;
  LogMessageVoidify local_1fe9;
  undefined1 local_1fe8 [8];
  stack_t old_sigstk;
  stack_t sigstk;
  char altstack [8096];
  int *stack_consumed_local;
  void *pc_local;
  
  g_pc_to_symbolize = pc;
  memset(&sigstk.ss_size,0x55,0x1fa0);
  memset(&old_sigstk.ss_size,0,0x18);
  old_sigstk.ss_size = (size_t)&sigstk.ss_size;
  sigstk.ss_flags = 0x1fa0;
  sigstk._12_4_ = 0;
  sigstk.ss_sp._0_4_ = 0;
  iVar1 = sigaltstack((sigaltstack *)&old_sigstk.ss_size,(sigaltstack *)local_1fe8);
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_1fe9);
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2050,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0xef,FATAL,0,in_R9);
    poVar3 = google::LogMessage::stream(&local_2050);
    poVar3 = std::operator<<(poVar3,"sigaltstack(&sigstk, &old_sigstk)");
    google::LogMessageVoidify::operator&(&local_1fe9,poVar3);
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2050);
  }
  memset(&old_sa1.sa_restorer,0,0x98);
  sigemptyset((sigset_t *)&sa);
  sa.sa_mask.__val[0xf]._0_4_ = 0x8000000;
  old_sa1.sa_restorer = EmptySignalHandler;
  iVar1 = sigaction(10,(sigaction *)&old_sa1.sa_restorer,(sigaction *)&old_sa2.sa_restorer);
  local_22b9 = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_2241);
    local_22b8 = google::LogMessage::SendToLog;
    uStack_22b0 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_22a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0xfa,FATAL,0,in_R9);
    local_22b9 = 1;
    poVar3 = google::LogMessage::stream(&local_22a8);
    poVar3 = std::operator<<(poVar3,"sigaction(SIGUSR1, &sa, &old_sa1)");
    google::LogMessageVoidify::operator&(&local_2241,poVar3);
  }
  if ((local_22b9 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_22a8);
  }
  old_sa1.sa_restorer = SymbolizeSignalHandler;
  iVar1 = sigaction(0xc,(sigaction *)&old_sa1.sa_restorer,(sigaction *)local_2240);
  local_2331 = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_22ba);
    local_2330 = google::LogMessage::SendToLog;
    uStack_2328 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2320,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0xfe,FATAL,0,in_R9);
    local_2331 = 1;
    poVar3 = google::LogMessage::stream(&local_2320);
    poVar3 = std::operator<<(poVar3,"sigaction(SIGUSR2, &sa, &old_sa2)");
    google::LogMessageVoidify::operator&(&local_22ba,poVar3);
  }
  if ((local_2331 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2320);
  }
  _Var2 = getpid();
  iVar1 = kill(_Var2,10);
  local_23a9 = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_2332);
    _stack_consumption1 = google::LogMessage::SendToLog;
    uStack_23a0 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2398,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x102,FATAL,0,in_R9);
    local_23a9 = 1;
    poVar3 = google::LogMessage::stream(&local_2398);
    poVar3 = std::operator<<(poVar3,"kill(getpid(), SIGUSR1)");
    google::LogMessageVoidify::operator&(&local_2332,poVar3);
  }
  if ((local_23a9 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2398);
  }
  local_23b0 = GetStackConsumption((char *)&sigstk.ss_size);
  _Var2 = getpid();
  iVar1 = kill(_Var2,0xc);
  local_2429 = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_23b1);
    _stack_consumption2 = google::LogMessage::SendToLog;
    uStack_2420 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2418,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x107,FATAL,0,in_R9);
    local_2429 = 1;
    poVar3 = google::LogMessage::stream(&local_2418);
    poVar3 = std::operator<<(poVar3,"kill(getpid(), SIGUSR2)");
    google::LogMessageVoidify::operator&(&local_23b1,poVar3);
  }
  if ((local_2429 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2418);
  }
  local_2430 = GetStackConsumption((char *)&sigstk.ss_size);
  if ((local_23b0 == -1) || (local_2430 == -1)) {
    *stack_consumed = -1;
  }
  else {
    *stack_consumed = local_2430 - local_23b0;
  }
  google::LogMessage::LogMessage
            (&local_2490,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
             ,0x113);
  poVar3 = google::LogMessage::stream(&local_2490);
  poVar3 = std::operator<<(poVar3,"Stack consumption of empty signal handler: ");
  std::ostream::operator<<(poVar3,local_23b0);
  google::LogMessage::~LogMessage(&local_2490);
  google::LogMessage::LogMessage
            (&local_24f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
             ,0x115);
  poVar3 = google::LogMessage::stream(&local_24f0);
  poVar3 = std::operator<<(poVar3,"Stack consumption of symbolize signal handler: ");
  std::ostream::operator<<(poVar3,local_2430);
  google::LogMessage::~LogMessage(&local_24f0);
  google::LogMessage::LogMessage
            (&local_2550,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
             ,0x117);
  poVar3 = google::LogMessage::stream(&local_2550);
  poVar3 = std::operator<<(poVar3,"Stack consumption of Symbolize: ");
  std::ostream::operator<<(poVar3,*stack_consumed);
  google::LogMessage::~LogMessage(&local_2550);
  iVar1 = sigaltstack((sigaltstack *)local_1fe8,(sigaltstack *)0x0);
  local_25c9 = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_2551);
    local_25c8 = google::LogMessage::SendToLog;
    uStack_25c0 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_25b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x11a,FATAL,0,in_R9);
    local_25c9 = 1;
    poVar3 = google::LogMessage::stream(&local_25b8);
    poVar3 = std::operator<<(poVar3,"sigaltstack(&old_sigstk, nullptr)");
    google::LogMessageVoidify::operator&(&local_2551,poVar3);
  }
  if ((local_25c9 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_25b8);
  }
  iVar1 = sigaction(10,(sigaction *)&old_sa2.sa_restorer,(sigaction *)0x0);
  local_2641 = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_25ca);
    local_2640 = google::LogMessage::SendToLog;
    uStack_2638 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2630,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x11b,FATAL,0,in_R9);
    local_2641 = 1;
    poVar3 = google::LogMessage::stream(&local_2630);
    poVar3 = std::operator<<(poVar3,"sigaction(SIGUSR1, &old_sa1, nullptr)");
    google::LogMessageVoidify::operator&(&local_25ca,poVar3);
  }
  if ((local_2641 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2630);
  }
  iVar1 = sigaction(0xc,(sigaction *)local_2240,(sigaction *)0x0);
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_2642);
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_26a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize_unittest.cc"
               ,0x11c,FATAL,0,in_R9);
    poVar3 = google::LogMessage::stream(&local_26a8);
    poVar3 = std::operator<<(poVar3,"sigaction(SIGUSR2, &old_sa2, nullptr)");
    google::LogMessageVoidify::operator&(&local_2642,poVar3);
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_26a8);
  }
  return g_symbolize_result;
}

Assistant:

static const char* SymbolizeStackConsumption(void* pc, int* stack_consumed) {
  g_pc_to_symbolize = pc;

  // The alt-signal-stack cannot be heap allocated because there is a
  // bug in glibc-2.2 where some signal handler setup code looks at the
  // current stack pointer to figure out what thread is currently running.
  // Therefore, the alternate stack must be allocated from the main stack
  // itself.
  char altstack[kAlternateStackSize];
  memset(altstack, kAlternateStackFillValue, kAlternateStackSize);

  // Set up the alt-signal-stack (and save the older one).
  stack_t sigstk;
  memset(&sigstk, 0, sizeof(stack_t));
  stack_t old_sigstk;
  sigstk.ss_sp = altstack;
  sigstk.ss_size = kAlternateStackSize;
  sigstk.ss_flags = 0;
  CHECK_ERR(sigaltstack(&sigstk, &old_sigstk));

  // Set up SIGUSR1 and SIGUSR2 signal handlers (and save the older ones).
  struct sigaction sa;
  memset(&sa, 0, sizeof(struct sigaction));
  struct sigaction old_sa1, old_sa2;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = SA_ONSTACK;

  // SIGUSR1 maps to EmptySignalHandler.
  sa.sa_handler = EmptySignalHandler;
  CHECK_ERR(sigaction(SIGUSR1, &sa, &old_sa1));

  // SIGUSR2 maps to SymbolizeSignalHanlder.
  sa.sa_handler = SymbolizeSignalHandler;
  CHECK_ERR(sigaction(SIGUSR2, &sa, &old_sa2));

  // Send SIGUSR1 signal and measure the stack consumption of the empty
  // signal handler.
  CHECK_ERR(kill(getpid(), SIGUSR1));
  int stack_consumption1 = GetStackConsumption(altstack);

  // Send SIGUSR2 signal and measure the stack consumption of the symbolize
  // signal handler.
  CHECK_ERR(kill(getpid(), SIGUSR2));
  int stack_consumption2 = GetStackConsumption(altstack);

  // The difference between the two stack consumption values is the
  // stack footprint of the Symbolize function.
  if (stack_consumption1 != -1 && stack_consumption2 != -1) {
    *stack_consumed = stack_consumption2 - stack_consumption1;
  } else {
    *stack_consumed = -1;
  }

  // Log the stack consumption values.
  LOG(INFO) << "Stack consumption of empty signal handler: "
            << stack_consumption1;
  LOG(INFO) << "Stack consumption of symbolize signal handler: "
            << stack_consumption2;
  LOG(INFO) << "Stack consumption of Symbolize: " << *stack_consumed;

  // Now restore the old alt-signal-stack and signal handlers.
  CHECK_ERR(sigaltstack(&old_sigstk, nullptr));
  CHECK_ERR(sigaction(SIGUSR1, &old_sa1, nullptr));
  CHECK_ERR(sigaction(SIGUSR2, &old_sa2, nullptr));

  return g_symbolize_result;
}